

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O1

void text_sequence_doit(t_text_sequence *x,int argc,t_atom *argv)

{
  t_float *ptVar1;
  t_atom *ptVar2;
  t_atomtype tVar3;
  undefined8 uVar4;
  char *pcVar5;
  int iVar6;
  _binbuf *x_00;
  t_atom *ptVar7;
  t_atom *ptVar8;
  t_symbol *ptVar9;
  word wVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  t_atom *ptVar15;
  ulong uVar16;
  long lVar17;
  _outlet *x_01;
  uint uVar18;
  int iVar19;
  _class **x_02;
  uint uVar20;
  uint argc_00;
  bool bVar21;
  t_float tVar22;
  t_float tVar23;
  t_float tVar24;
  t_float tVar25;
  t_atom tStack_68;
  t_atom *local_58;
  t_atom *local_50;
  uint local_44;
  ulong local_40;
  undefined4 local_38;
  bool local_31;
  
  uVar16 = (ulong)(uint)argc;
  ptVar15 = &tStack_68;
  local_50 = (t_atom *)CONCAT44(local_50._4_4_,argc);
  local_58 = argv;
  x_00 = text_client_getbuf(&x->x_tc);
  if (x_00 == (_binbuf *)0x0) {
LAB_0018f644:
    x->x_onset = 0x7fffffff;
    x->x_loop = '\0';
    x->x_auto = '\0';
    outlet_bang(x->x_endout);
    return;
  }
  ptVar7 = binbuf_getvec(x_00);
  iVar6 = binbuf_getnatom(x_00);
  iVar19 = x->x_onset;
  if (iVar6 <= iVar19) goto LAB_0018f644;
  lVar14 = (long)iVar19;
  iVar11 = iVar19;
  if (x->x_lastto == (t_symbol *)0x0) {
    uVar16 = lVar14 * 0x10;
    ptVar8 = ptVar7 + lVar14;
    tVar3 = ptVar7[lVar14].a_type;
    if ((((tVar3 != A_FLOAT) || (x->x_waitargc == 0)) || (x->x_eaten != '\0')) &&
       ((tVar3 != A_SYMBOL || ((ptVar8->a_w).w_symbol != x->x_waitsym)))) goto LAB_0018f5fe;
    if (tVar3 == A_FLOAT) {
      if (iVar19 < iVar6) {
        iVar12 = x->x_waitargc + iVar19;
        if (iVar12 < iVar19) {
          iVar12 = iVar19;
        }
        lVar17 = iVar12 - lVar14;
        ptVar8 = ptVar7 + lVar14;
        iVar13 = iVar19;
        do {
          bVar21 = lVar17 == 0;
          lVar17 = lVar17 + -1;
          iVar11 = iVar12;
          if ((bVar21) || (iVar11 = iVar13, ptVar8->a_type != A_FLOAT)) break;
          iVar13 = iVar13 + 1;
          ptVar8 = ptVar8 + 1;
          iVar11 = iVar6;
        } while (iVar6 != iVar13);
      }
      x->x_eaten = '\x01';
      iVar12 = 0;
    }
    else {
      iVar12 = iVar19;
      if (iVar19 < iVar6) {
        do {
          iVar11 = iVar12;
          if ((ptVar8->a_type & ~A_FLOAT) == A_SEMI) break;
          iVar12 = iVar12 + 1;
          ptVar8 = ptVar8 + 1;
          iVar11 = iVar6;
        } while (iVar6 != iVar12);
      }
      x->x_eaten = '\x01';
      iVar19 = iVar19 + 1;
      iVar12 = 1;
    }
    local_31 = true;
    local_38 = 0;
  }
  else {
LAB_0018f5fe:
    if (iVar19 < iVar6) {
      ptVar8 = ptVar7 + lVar14;
      do {
        tVar3 = ptVar8->a_type;
        uVar16 = (ulong)tVar3;
        if ((tVar3 & ~A_FLOAT) == A_SEMI) {
          x->x_eaten = '\0';
          local_31 = tVar3 != A_COMMA;
          local_38 = (int)CONCAT71((int7)((ulong)ptVar8 >> 8),1);
          iVar12 = 1;
          goto LAB_0018f71b;
        }
        iVar11 = iVar11 + 1;
        ptVar8 = ptVar8 + 1;
      } while (iVar6 != iVar11);
    }
    x->x_eaten = '\0';
    iVar12 = 1;
    local_31 = true;
    local_38 = (int)CONCAT71((int7)(uVar16 >> 8),1);
  }
LAB_0018f71b:
  uVar20 = iVar11 - iVar19;
  iVar13 = 0x7fffffff;
  if (iVar12 + iVar11 < iVar6) {
    iVar13 = iVar12 + iVar11;
  }
  x->x_onset = iVar13;
  local_44 = uVar20 + 1;
  if ((int)uVar20 < 99) {
    ptVar15 = &tStack_68 + -(long)(int)local_44;
    ptVar8 = ptVar15;
  }
  else {
    ptVar8 = (t_atom *)getbytes((ulong)local_44 << 4);
  }
  local_40 = (ulong)uVar20;
  if (0 < (int)uVar20) {
    tStack_68.a_w.w_binbuf = (_binbuf *)(local_58 + -1);
    lVar14 = 0;
    do {
      ptVar2 = local_58;
      iVar6 = *(int *)((long)&ptVar7[iVar19].a_type + lVar14);
      if (iVar6 - 1U < 2) {
        ptVar1 = (t_float *)((long)&ptVar7[iVar19].a_w + lVar14);
        tVar22 = ptVar1[-2];
        tVar23 = ptVar1[-1];
        tVar24 = *ptVar1;
        tVar25 = ptVar1[1];
LAB_0018f7a6:
        ptVar1 = (t_float *)((long)&ptVar8->a_type + lVar14);
        *ptVar1 = tVar22;
        ptVar1[1] = tVar23;
        ptVar1[2] = tVar24;
        ptVar1[3] = tVar25;
      }
      else {
        iVar11 = (int)local_50;
        if (iVar6 == 9) {
          ptVar9 = *(t_symbol **)((long)&ptVar7[iVar19].a_w + lVar14);
          ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f805;
          ptVar9 = binbuf_realizedollsym(ptVar9,iVar11,ptVar2,0);
          if (ptVar9 == (t_symbol *)0x0) {
            uVar4 = **(undefined8 **)((long)&ptVar7[iVar19].a_w + lVar14);
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f84d;
            pd_error((void *)0x0,"$%s: not enough arguments supplied",uVar4);
            *(undefined4 *)((long)&ptVar8->a_type + lVar14) = 2;
            ptVar9 = &s_symbol;
          }
          else {
            *(undefined4 *)((long)&ptVar8->a_type + lVar14) = 2;
          }
          *(t_symbol **)((long)&ptVar8->a_w + lVar14) = ptVar9;
        }
        else if (iVar6 == 8) {
          uVar18 = *(uint *)((long)&ptVar7[iVar19].a_w + lVar14);
          if (0 < (int)uVar18 && (int)uVar18 <= (int)local_50) {
            ptVar2 = (t_atom *)(tStack_68.a_w.w_binbuf + uVar18);
            tVar22 = (t_float)ptVar2->a_type;
            tVar23 = *(t_float *)&ptVar2->field_0x4;
            tVar24 = (ptVar2->a_w).w_float;
            tVar25 = *(t_float *)((long)&ptVar2->a_w + 4);
            goto LAB_0018f7a6;
          }
          ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f7df;
          pd_error(x,"argument $%d out of range");
          *(undefined4 *)((long)&ptVar8->a_type + lVar14) = 1;
          *(undefined4 *)((long)&ptVar8->a_w + lVar14) = 0;
        }
        else {
          ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f823;
          bug("text sequence");
        }
      }
      lVar14 = lVar14 + 0x10;
    } while ((ulong)uVar20 << 4 != lVar14);
  }
  argc_00 = (uint)local_40;
  uVar20 = argc_00;
  uVar18 = argc_00;
  if ((char)local_38 == '\0') {
    x->x_loop = '\0';
    x->x_lastto = (t_symbol *)0x0;
    if (((argc_00 == 1) && (x->x_auto != '\0')) && (ptVar8->a_type == A_FLOAT)) {
      x->x_nextdelay = (ptVar8->a_w).w_float;
      goto LAB_0018fa39;
    }
    x_01 = x->x_waitout;
    if (x_01 == (_outlet *)0x0) {
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f99a;
      bug("text sequence 3");
      goto LAB_0018fa39;
    }
    x->x_auto = '\0';
  }
  else {
    if (x->x_mainout == (_outlet *)0x0) {
      if (argc_00 != 0) {
        ptVar9 = x->x_lastto;
        ptVar7 = ptVar8;
        if (ptVar9 == (t_symbol *)0x0) {
          if (ptVar8->a_type == A_SYMBOL) {
            ptVar9 = (ptVar8->a_w).w_symbol;
          }
          else {
            ptVar9 = (t_symbol *)0x0;
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f9b0;
            bug("text sequence 2");
          }
          ptVar7 = ptVar8 + 1;
          argc_00 = (int)local_40 - 1;
        }
        if (ptVar9 == (t_symbol *)0x0) {
          x_02 = (t_pd *)0x0;
        }
        else {
          x_02 = ptVar9->s_thing;
          if (x_02 == (_class **)0x0) {
            pcVar5 = ptVar9->s_name;
            x_02 = (t_pd *)0x0;
            local_50 = ptVar7;
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f9e7;
            pd_error(x,"%s: no such object",pcVar5);
            ptVar7 = local_50;
          }
        }
        if (local_31 != false) {
          ptVar9 = (t_symbol *)0x0;
        }
        x->x_lastto = ptVar9;
        uVar18 = (uint)local_40;
        if (x_02 != (t_pd *)0x0) {
          if (((int)argc_00 < 1) || (ptVar7->a_type != A_SYMBOL)) {
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18fa39;
            pd_list(x_02,(t_symbol *)0x0,argc_00,ptVar7);
          }
          else {
            ptVar9 = (ptVar7->a_w).w_symbol;
            ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18fa2a;
            pd_typedmess(x_02,ptVar9,argc_00 - 1,ptVar7 + 1);
          }
        }
      }
      goto LAB_0018fa39;
    }
    if (x->x_lastto != (t_symbol *)0x0) {
      ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f8a4;
      memmove(ptVar8 + 1,ptVar8,(long)(int)argc_00 << 4);
      ptVar8->a_type = A_SYMBOL;
      ptVar8->a_w = (word)x->x_lastto;
      uVar20 = local_44;
    }
    if (local_31 == false) {
      if (((argc_00 != 0) && (x->x_lastto == (t_symbol *)0x0)) && (ptVar8->a_type == A_SYMBOL)) {
        wVar10 = ptVar8->a_w;
        goto LAB_0018f8c6;
      }
    }
    else {
      wVar10.w_symbol = (t_symbol *)0x0;
LAB_0018f8c6:
      x->x_lastto = (t_symbol *)wVar10;
    }
    x_01 = x->x_mainout;
  }
  ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18f931;
  outlet_list(x_01,(t_symbol *)0x0,uVar20,ptVar8);
LAB_0018fa39:
  if (0x62 < (int)uVar18) {
    uVar16 = (ulong)local_44;
    ptVar15[-1].a_w.w_symbol = (t_symbol *)0x18fa4e;
    freebytes(ptVar8,uVar16 << 4);
  }
  return;
}

Assistant:

static void text_sequence_doit(t_text_sequence *x, int argc, t_atom *argv)
{
    t_binbuf *b = text_client_getbuf(&x->x_tc);
    int n, i, onset, nfield, wait, eatsemi = 1, gotcomma = 0;
    t_atom *vec, *outvec, *ap;
    if (!b)
        goto nosequence;
    vec = binbuf_getvec(b);
    n = binbuf_getnatom(b);
    if (x->x_onset >= n)
    {
    nosequence:
        x->x_onset = 0x7fffffff;
        x->x_loop = x->x_auto = 0;
        outlet_bang(x->x_endout);
        return;
    }
    onset = x->x_onset;

        /* test if leading numbers, or a leading symbol equal to our
        "wait symbol", are directing us to wait */
    if (!x->x_lastto && (
        (vec[onset].a_type == A_FLOAT && x->x_waitargc && !x->x_eaten) ||
            (vec[onset].a_type == A_SYMBOL &&
                vec[onset].a_w.w_symbol == x->x_waitsym)))
    {
        if (vec[onset].a_type == A_FLOAT)
        {
            for (i = onset; i < n && i < onset + x->x_waitargc &&
                vec[i].a_type == A_FLOAT; i++)
                    ;
            x->x_eaten = 1;
            eatsemi = 0;
        }
        else
        {
            for (i = onset; i < n && vec[i].a_type != A_SEMI &&
                vec[i].a_type != A_COMMA; i++)
                    ;
            x->x_eaten = 1;
            onset++;    /* symbol isn't part of wait list */
        }
        wait = 1;
    }
    else    /* message to send */
    {
        for (i = onset; i < n && vec[i].a_type != A_SEMI &&
            vec[i].a_type != A_COMMA; i++)
                ;
        wait = 0;
        x->x_eaten = 0;
        if (i < n && vec[i].a_type == A_COMMA)
            gotcomma = 1;
    }
    nfield = i - onset;
    i += eatsemi;
    if (i >= n)
        i = 0x7fffffff;
    x->x_onset = i;
        /* generate output list, realizing dolar sign atoms.  Allocate one
        extra atom in case we want to prepend a symbol later */
    ATOMS_ALLOCA(outvec, nfield+1);
    for (i = 0, ap = vec+onset; i < nfield; i++, ap++)
    {
        int type = ap->a_type;
        if (type == A_FLOAT || type == A_SYMBOL)
            outvec[i] = *ap;
        else if (type == A_DOLLAR)
        {
            int atno = ap->a_w.w_index-1;
            if (atno < 0 || atno >= argc)
            {
                pd_error(x, "argument $%d out of range", atno+1);
                SETFLOAT(outvec+i, 0);
            }
            else outvec[i] = argv[atno];
        }
        else if (type == A_DOLLSYM)
        {
            t_symbol *s =
                binbuf_realizedollsym(ap->a_w.w_symbol, argc, argv, 0);
            if (s)
                SETSYMBOL(outvec+i, s);
            else
            {
                pd_error(0, "$%s: not enough arguments supplied",
                    ap->a_w.w_symbol->s_name);
                SETSYMBOL(outvec+i, &s_symbol);
            }
        }
        else bug("text sequence");
    }
    if (wait)
    {
        x->x_loop = 0;
        x->x_lastto = 0;
        if (x->x_auto && nfield == 1 && outvec[0].a_type == A_FLOAT)
            x->x_nextdelay = outvec[0].a_w.w_float;
        else if (!x->x_waitout)
            bug("text sequence 3");
        else
        {
            x->x_auto = 0;
            outlet_list(x->x_waitout, 0, nfield, outvec);
        }
    }
    else if (x->x_mainout)
    {
        int n2 = nfield;
        if (x->x_lastto)
        {
            memmove(outvec+1, outvec, nfield * sizeof(*outvec));
            SETSYMBOL(outvec, x->x_lastto);
            n2++;
        }
        if (!gotcomma)
            x->x_lastto = 0;
        else if (!x->x_lastto && nfield && outvec->a_type == A_SYMBOL)
            x->x_lastto = outvec->a_w.w_symbol;
        outlet_list(x->x_mainout, 0, n2, outvec);
    }
    else if (nfield)
    {
        t_symbol *tosym = x->x_lastto;
        t_pd *to = 0;
        t_atom *vecleft = outvec;
        int nleft = nfield;
        if (!tosym)
        {
            if (outvec[0].a_type != A_SYMBOL)
                bug("text sequence 2");
            else tosym = outvec[0].a_w.w_symbol;
            vecleft++;
            nleft--;
        }
        if (tosym)
        {
            if (!(to = tosym->s_thing))
                pd_error(x, "%s: no such object", tosym->s_name);
        }
        x->x_lastto = (gotcomma ? tosym : 0);
        if (to)
        {
            if (nleft > 0 && vecleft[0].a_type == A_SYMBOL)
                typedmess(to, vecleft->a_w.w_symbol, nleft-1, vecleft+1);
            else pd_list(to, 0, nleft, vecleft);
        }
    }
    ATOMS_FREEA(outvec, nfield+1);
}